

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O2

int __thiscall TPZIntTriang::NPoints(TPZIntTriang *this)

{
  return this->fIntKsi->fNumInt;
}

Assistant:

int TPZIntTriang::NPoints() const {
#ifdef PZDEBUG
	if (!fIntKsi){
		PZError << "Null Pointer passed to method TPZIntTriang::NPoints()\n";
        DebugStop();
		return 0;
	}
#endif
	return fIntKsi->NInt();
}